

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_xml.cpp
# Opt level: O0

void __thiscall
Kumu::XMLElement::RenderElement(XMLElement *this,string *outbuf,ui32_t *depth,bool *pretty)

{
  bool bVar1;
  reference pNVar2;
  long lVar3;
  reference ppXVar4;
  ui32_t local_4c;
  _Self local_48;
  _Self local_40;
  Elem_i i_1;
  _Self local_30;
  Attr_i i;
  bool *pretty_local;
  ui32_t *depth_local;
  string *outbuf_local;
  XMLElement *this_local;
  
  i._M_node = (_List_node_base *)pretty;
  if ((*pretty & 1U) != 0) {
    add_spacer(outbuf,*depth);
  }
  std::__cxx11::string::operator+=((string *)outbuf,"<");
  std::__cxx11::string::operator+=((string *)outbuf,(string *)&this->m_Name);
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::list<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>::begin(&this->m_AttrList);
  while( true ) {
    i_1._M_node = (_List_node_base *)
                  std::__cxx11::list<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>::end
                            (&this->m_AttrList);
    bVar1 = std::operator!=(&local_30,(_Self *)&i_1);
    if (!bVar1) break;
    std::__cxx11::string::operator+=((string *)outbuf," ");
    pNVar2 = std::_List_const_iterator<Kumu::NVPair>::operator*(&local_30);
    std::__cxx11::string::operator+=((string *)outbuf,(string *)pNVar2);
    std::__cxx11::string::operator+=((string *)outbuf,"=\"");
    pNVar2 = std::_List_const_iterator<Kumu::NVPair>::operator*(&local_30);
    std::__cxx11::string::operator+=((string *)outbuf,(string *)&pNVar2->value);
    std::__cxx11::string::operator+=((string *)outbuf,"\"");
    std::_List_const_iterator<Kumu::NVPair>::operator++(&local_30);
  }
  std::__cxx11::string::operator+=((string *)outbuf,">");
  bVar1 = std::__cxx11::list<Kumu::XMLElement_*,_std::allocator<Kumu::XMLElement_*>_>::empty
                    (&this->m_ChildList);
  if (bVar1) {
    lVar3 = std::__cxx11::string::length();
    if (lVar3 != 0) {
      std::__cxx11::string::operator+=((string *)outbuf,(string *)&this->m_Body);
    }
  }
  else {
    std::__cxx11::string::operator+=((string *)outbuf,"\n");
    lVar3 = std::__cxx11::string::length();
    if (lVar3 != 0) {
      std::__cxx11::string::operator+=((string *)outbuf,(string *)&this->m_Body);
    }
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::list<Kumu::XMLElement_*,_std::allocator<Kumu::XMLElement_*>_>::begin
                   (&this->m_ChildList);
    while( true ) {
      local_48._M_node =
           (_List_node_base *)
           std::__cxx11::list<Kumu::XMLElement_*,_std::allocator<Kumu::XMLElement_*>_>::end
                     (&this->m_ChildList);
      bVar1 = std::operator!=(&local_40,&local_48);
      if (!bVar1) break;
      ppXVar4 = std::_List_const_iterator<Kumu::XMLElement_*>::operator*(&local_40);
      local_4c = *depth + 1;
      RenderElement(*ppXVar4,outbuf,&local_4c,(bool *)i._M_node);
      std::_List_const_iterator<Kumu::XMLElement_*>::operator++(&local_40);
    }
    if (((ulong)(i._M_node)->_M_next & 1) != 0) {
      add_spacer(outbuf,*depth);
    }
  }
  std::__cxx11::string::operator+=((string *)outbuf,"</");
  std::__cxx11::string::operator+=((string *)outbuf,(string *)&this->m_Name);
  std::__cxx11::string::operator+=((string *)outbuf,">\n");
  return;
}

Assistant:

void
Kumu::XMLElement::RenderElement(std::string& outbuf, const ui32_t& depth, const bool& pretty) const
{
  if ( pretty )
    {
      add_spacer(outbuf, depth);
    }

  outbuf += "<";
  outbuf += m_Name;

  // render attributes
  for ( Attr_i i = m_AttrList.begin(); i != m_AttrList.end(); ++i )
    {
      outbuf += " ";
      outbuf += (*i).name;
      outbuf += "=\"";
      outbuf += (*i).value;
      outbuf += "\"";
    }

  outbuf += ">";

  // body contents and children
  if ( ! m_ChildList.empty() )
    {
      outbuf += "\n";

      // render body
      if ( m_Body.length() > 0 )
	{
	  outbuf += m_Body;
	}

      for ( Elem_i i = m_ChildList.begin(); i != m_ChildList.end(); ++i )
	{
	  (*i)->RenderElement(outbuf, depth + 1, pretty);
	}

      if ( pretty )
	{
	  add_spacer(outbuf, depth);
	}
    }
  else if ( m_Body.length() > 0 )
    {
      outbuf += m_Body;
    }

  outbuf += "</";
  outbuf += m_Name;
  outbuf += ">\n";
}